

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O0

int re_backsearch(int f,int n)

{
  int iVar1;
  int s;
  int n_local;
  int f_local;
  
  n_local = re_readpattern("RE Search backward");
  if (n_local == 1) {
    iVar1 = re_backsrch();
    if (iVar1 == 0) {
      dobeep();
      ewprintf("Search failed: \"%s\"",re_pat);
      n_local = 0;
    }
    else {
      re_srch_lastdir = -2;
      n_local = 1;
    }
  }
  return n_local;
}

Assistant:

int
re_backsearch(int f, int n)
{
	int	s;

	if ((s = re_readpattern("RE Search backward")) != TRUE)
		return (s);
	if (re_backsrch() == FALSE) {
		dobeep();
		ewprintf("Search failed: \"%s\"", re_pat);
		return (FALSE);
	}
	re_srch_lastdir = SRCH_BACK;
	return (TRUE);
}